

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceDecomposition::fillPreForceData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  uint uVar1;
  uint i;
  long lVar2;
  
  sdat->atid = (this->idents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[atom];
  if (&sdat->selfPot != &this->selfPot) {
    lVar2 = 0;
    do {
      (sdat->selfPot).data_[lVar2] = (this->selfPot).data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
  }
  if (&sdat->selePot != &this->selectedSelfPot) {
    lVar2 = 0;
    do {
      (sdat->selePot).data_[lVar2] = (this->selectedSelfPot).data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
  }
  uVar1 = this->atomStorageLayout_;
  if ((char)uVar1 < '\0') {
    sdat->rho = (this->snap_->atomData).density.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[atom];
  }
  if ((uVar1 & 0x40) != 0) {
    sdat->particlePot =
         (this->snap_->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[atom];
  }
  return;
}

Assistant:

void ForceDecomposition::fillPreForceData(SelfData& sdat, int atom) {
    sdat.atid    = idents[atom];
    sdat.selfPot = selfPot;
    sdat.selePot = selectedSelfPot;

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      sdat.rho = snap_->atomData.density[atom];
    }

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      sdat.particlePot = snap_->atomData.particlePot[atom];
    }
  }